

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  bool bVar1;
  byte *__s;
  UIntToStringBuffer buffer;
  allocator<char> local_29;
  byte local_28 [23];
  byte local_11 [9];
  
  __s = local_11 + 1;
  local_11[1] = 0;
  do {
    __s[-1] = (char)this + (char)(Json *)((ulong)this / 10) * -10 | 0x30;
    __s = __s + -1;
    bVar1 = (Json *)0x9 < this;
    this = (Json *)((ulong)this / 10);
  } while (bVar1);
  if (local_28 <= __s) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)__s,&local_29);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x9c,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

JSONCPP_STRING valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}